

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

RunData<unsigned_long> * __thiscall
anon_unknown.dwarf_60356::InitData<unsigned_long>::run_data
          (InitData<unsigned_long> *this,uint32_t array_size)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  RunData<unsigned_long> *in_RDI;
  uint32_t in_stack_0000004c;
  RunData<unsigned_long> *in_stack_00000050;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_00000058;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_00000060;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_RSI);
  (anonymous_namespace)::RunData<unsigned_long>::
  RunData<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (in_stack_00000050,in_stack_0000004c,in_stack_00000060,in_stack_00000058);
  return in_RDI;
}

Assistant:

RunData<KeyType> run_data(uint32_t array_size) const 
    {
        assert(array_size <= MAX_SIZE);
        return RunData<KeyType>(array_size, keys_.begin(), values_.begin());
    }